

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O0

bool __thiscall
Rml::DecoratorRadialGradient::Initialise
          (DecoratorRadialGradient *this,bool in_repeating,Shape in_shape,SizeType in_size_type,
          Vector2Numeric in_size,Vector2Numeric in_position,ColorStopList *in_color_stops)

{
  bool bVar1;
  SizeType in_size_type_local;
  Shape in_shape_local;
  bool in_repeating_local;
  DecoratorRadialGradient *this_local;
  Vector2Numeric in_size_local;
  
  this->repeating = in_repeating;
  this->shape = in_shape;
  this->size_type = in_size_type;
  (this->size).x = in_size.x;
  (this->size).y = in_size.y;
  (this->position).x = in_position.x;
  (this->position).y = in_position.y;
  ::std::vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>::operator=
            (&this->color_stops,in_color_stops);
  bVar1 = ::std::vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>::empty(&this->color_stops);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool DecoratorRadialGradient::Initialise(bool in_repeating, Shape in_shape, SizeType in_size_type, Vector2Numeric in_size, Vector2Numeric in_position,
	const ColorStopList& in_color_stops)
{
	repeating = in_repeating;
	shape = in_shape;
	size_type = in_size_type;
	size = in_size;
	position = in_position;
	color_stops = in_color_stops;
	return !color_stops.empty();
}